

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,HasherHandle hasher,ZopfliNode *nodes)

{
  uint uVar1;
  BackwardMatch *pBVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t local_21c0;
  size_t local_21a8;
  ulong local_2198;
  ulong local_2170;
  uint local_2168;
  ulong local_2158;
  size_t local_2150;
  size_t local_2140;
  ulong local_2138;
  size_t local_2128;
  ulong local_2120;
  size_t local_2118;
  size_t num_matches;
  size_t skip;
  size_t max_distance;
  size_t pos;
  size_t lz_matches_offset;
  size_t gap;
  size_t i;
  size_t store_end;
  BackwardMatch matches [384];
  StartPosQueue queue;
  ZopfliCostModel model;
  size_t max_zopfli_len;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  size_t distance;
  ulong uStack_830;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  ulong local_758;
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  BrotliEncoderParams *local_728;
  long local_720;
  ulong local_718;
  ulong local_710;
  ulong local_708;
  size_t local_700;
  uint8_t *local_6f8;
  BrotliEncoderDictionary *local_6f0;
  HasherHandle local_6e8;
  ulong local_6e0;
  undefined8 local_6d8;
  size_t *local_6d0;
  size_t *local_6c8;
  BackwardMatch *local_6c0;
  ulong local_6b8;
  undefined8 local_6b0;
  size_t local_6a8;
  ulong local_6a0;
  H10 *local_698;
  size_t j;
  size_t i_2;
  H10 *local_680;
  ulong local_678;
  uint8_t *local_670;
  HasherHandle local_668;
  ulong local_660;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_638;
  uint8_t *local_630;
  size_t local_628;
  ulong local_620;
  ulong local_618;
  BackwardMatch *local_610;
  ulong local_608;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t *forest;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  ulong *local_590;
  ulong local_588;
  ulong local_580;
  size_t local_578;
  ulong local_570;
  uint8_t *local_568;
  ulong *local_560;
  size_t local_558;
  size_t local_550;
  undefined8 local_548;
  ulong local_540;
  ulong local_538;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_510;
  uint8_t *local_508;
  size_t local_500;
  ulong local_4f8;
  size_t local_4f0;
  size_t local_4e8;
  HasherHandle local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  BackwardMatch *local_4c0;
  ulong *local_4b8;
  ulong *local_4b0;
  ulong *local_4a8;
  ulong *local_4a0;
  ulong *local_498;
  ulong *local_490;
  ulong *local_488;
  ulong *local_480;
  ulong *local_478;
  size_t local_470;
  ulong *local_468;
  size_t local_460;
  ulong *local_458;
  ulong local_450;
  ulong *local_448;
  size_t local_440;
  ulong *local_438;
  size_t local_430;
  ulong *local_428;
  ulong local_420;
  ulong *local_418;
  HasherHandle local_410;
  ulong local_408;
  size_t max_backward;
  H10 *self;
  ulong local_3f0;
  uint8_t *local_3e8;
  HasherHandle local_3e0;
  ulong local_3d8;
  size_t len_2;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t *forest_1;
  uint32_t key_1;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_2;
  ulong *local_360;
  ulong local_358;
  long local_350;
  ulong local_348;
  H10 *local_340;
  uint8_t *local_338;
  ulong *local_330;
  size_t local_328;
  size_t local_320;
  undefined8 local_318;
  undefined8 local_310;
  ulong local_308;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2e0;
  uint8_t *local_2d8;
  size_t local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  size_t local_2b8;
  HasherHandle local_2b0;
  ulong *local_2a8;
  ulong *local_2a0;
  ulong *local_298;
  ulong *local_290;
  ulong *local_288;
  size_t local_280;
  ulong *local_278;
  size_t local_270;
  ulong *local_268;
  H10 *local_260;
  ulong *local_258;
  size_t local_250;
  ulong *local_248;
  size_t local_240;
  ulong *local_238;
  H10 *local_230;
  ulong *local_228;
  HasherHandle local_220;
  ulong local_218;
  size_t max_backward_1;
  H10 *self_1;
  ulong local_200;
  uint8_t *local_1f8;
  HasherHandle local_1f0;
  ulong local_1e8;
  size_t len_3;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t *forest_2;
  uint32_t key_2;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_3;
  ulong *local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  size_t local_150;
  uint8_t *local_148;
  ulong *local_140;
  size_t local_138;
  size_t local_130;
  undefined8 local_128;
  undefined8 local_120;
  ulong local_118;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_f0;
  uint8_t *local_e8;
  size_t local_e0;
  ulong local_d8;
  ulong local_d0;
  size_t local_c8;
  HasherHandle local_c0;
  ulong *local_b8;
  ulong *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  ulong *local_98;
  size_t local_90;
  ulong *local_88;
  size_t local_80;
  ulong *local_78;
  ulong local_70;
  ulong *local_68;
  size_t local_60;
  ulong *local_58;
  size_t local_50;
  ulong *local_48;
  ulong local_40;
  ulong *local_38;
  HasherHandle local_30;
  
  uVar3 = 0x145;
  if (params->quality < 0xb) {
    uVar3 = 0x96;
  }
  local_2120 = position;
  if (0x7f < num_bytes) {
    local_2120 = (position + num_bytes) - 0x7f;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,(ZopfliCostModel *)&queue.idx_,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts
            ((ZopfliCostModel *)&queue.idx_,position,ringbuffer,ringbuffer_mask);
  queue.q_[7].costdiff = 0.0;
  queue.q_[7].cost = 0.0;
  gap = 0;
  do {
    if (num_bytes <= gap + 3) {
      CleanupZopfliCostModel(m,(ZopfliCostModel *)&queue.idx_);
      sVar8 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar8;
    }
    uVar5 = position + gap;
    local_2128 = uVar5;
    if (max_backward_limit <= uVar5) {
      local_2128 = max_backward_limit;
    }
    local_6f0 = &params->dictionary;
    local_710 = num_bytes - gap;
    cur_ix_masked = (size_t)&store_end;
    local_6e8 = hasher;
    local_718 = local_2128;
    local_720 = 0;
    best_len = uVar5 & ringbuffer_mask;
    short_match_max_backward = 1;
    iVar4 = 0x40;
    if (params->quality != 0xb) {
      iVar4 = 0x10;
    }
    local_758 = uVar5 - (long)iVar4;
    orig_matches = (BackwardMatch *)cur_ix_masked;
    prev_ix = uVar5;
    if (uVar5 < (ulong)(long)iVar4) {
      local_758 = 0;
      orig_matches = (BackwardMatch *)cur_ix_masked;
    }
    while ((prev_ix = prev_ix - 1, local_758 < prev_ix && short_match_max_backward < 3 &&
           (uVar7 = uVar5 - prev_ix, uVar7 <= local_2128))) {
      uVar6 = ringbuffer_mask & prev_ix;
      if ((ringbuffer[best_len] == ringbuffer[uVar6]) &&
         (ringbuffer[best_len + 1] == ringbuffer[uVar6 + 1])) {
        local_630 = ringbuffer + uVar6;
        local_638 = (ulong *)(ringbuffer + best_len);
        limit2 = 0;
        x = (local_710 >> 3) + 1;
LAB_0011fd4b:
        x = x - 1;
        if (x != 0) {
          local_480 = local_638;
          local_488 = (ulong *)(local_630 + limit2);
          if (*local_638 == *local_488) goto LAB_0011fdad;
          local_490 = local_638;
          local_498 = (ulong *)(local_630 + limit2);
          iVar4 = 0;
          matching_bits = *local_638 ^ *local_498;
          for (uVar6 = matching_bits; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_660 = (ulong)iVar4;
          local_628 = (local_660 >> 3) + limit2;
          matched = local_710;
          goto LAB_0011feee;
        }
        matched = (local_710 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (local_630[limit2] != (uint8_t)*local_638) {
            local_628 = limit2;
            goto LAB_0011feee;
          }
          local_638 = (ulong *)((long)local_638 + 1);
          limit2 = limit2 + 1;
        }
        local_628 = limit2;
LAB_0011feee:
        limit2 = local_628;
        if (short_match_max_backward < local_628) {
          short_match_max_backward = local_628;
          local_610 = orig_matches;
          local_620 = local_628;
          orig_matches->distance = (uint32_t)uVar7;
          orig_matches->length_and_code = (uint32_t)(local_628 << 5);
          orig_matches = orig_matches + 1;
          local_618 = uVar7;
        }
      }
    }
    local_728 = params;
    local_708 = uVar5;
    local_700 = ringbuffer_mask;
    local_6f8 = ringbuffer;
    if (short_match_max_backward < local_710) {
      local_4e0 = hasher;
      local_410 = hasher;
      local_560 = (ulong *)(hasher + 0x28);
      local_588 = local_2128;
      local_590 = &short_match_max_backward;
      cur_ix_masked_1 = (size_t)orig_matches;
      max_comp_len = uVar5 & ringbuffer_mask;
      local_548 = 0x80;
      local_2138 = local_710;
      if (0x7f < local_710) {
        local_2138 = 0x80;
      }
      _key = local_2138;
      forest._4_4_ = (uint)(0x7f < local_710);
      local_580 = local_710;
      local_578 = ringbuffer_mask;
      local_570 = uVar5;
      local_568 = ringbuffer;
      local_540 = local_710;
      forest._0_4_ = HashBytesH10(ringbuffer + max_comp_len);
      local_478 = local_560;
      prev_ix_1 = (size_t)(local_560 + 0x10002);
      uVar1 = *(uint *)((long)local_560 + (ulong)(uint32_t)forest * 4 + 8);
      local_448 = local_560;
      local_450 = local_570;
      node_right = (local_570 & *local_560) << 1;
      local_418 = local_560;
      local_420 = local_570;
      best_len_left = (local_570 & *local_560) * 2 + 1;
      best_len_right = 0;
      depth_remaining = 0;
      if (forest._4_4_ != 0) {
        *(int *)((long)local_560 + (ulong)(uint32_t)forest * 4 + 8) = (int)local_570;
      }
      backward_1 = 0x40;
      while( true ) {
        node_left = (size_t)uVar1;
        prev_ix_masked = local_570 - node_left;
        cur_len = node_left & local_578;
        if (((prev_ix_masked == 0) || (local_588 < prev_ix_masked)) || (backward_1 == 0)) break;
        local_550 = best_len_right;
        local_558 = depth_remaining;
        if (best_len_right < depth_remaining) {
          local_2140 = best_len_right;
        }
        else {
          local_2140 = depth_remaining;
        }
        len_1 = local_2140;
        local_508 = local_568 + max_comp_len + local_2140;
        local_510 = (ulong *)(local_568 + cur_len + local_2140);
        matched_1 = local_580 - local_2140;
        limit2_1 = 0;
        x_1 = (matched_1 >> 3) + 1;
LAB_0012033b:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          local_4a0 = local_510;
          local_4a8 = (ulong *)(local_508 + limit2_1);
          if (*local_510 == *local_4a8) goto LAB_0012039d;
          local_4b0 = local_510;
          local_4b8 = (ulong *)(local_508 + limit2_1);
          iVar4 = 0;
          matching_bits_1 = *local_510 ^ *local_4b8;
          for (uVar7 = matching_bits_1; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_538 = (ulong)iVar4;
          local_500 = (local_538 >> 3) + limit2_1;
          goto LAB_001204de;
        }
        matched_1 = (matched_1 & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (local_508[limit2_1] != (uint8_t)*local_510) {
            local_500 = limit2_1;
            goto LAB_001204de;
          }
          local_510 = (ulong *)((long)local_510 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_500 = limit2_1;
LAB_001204de:
        local_608 = local_2140 + local_500;
        limit2_1 = local_500;
        if ((cur_ix_masked_1 != 0) && (*local_590 < local_608)) {
          *local_590 = local_608;
          local_4e8 = cur_ix_masked_1;
          local_4f0 = prev_ix_masked;
          local_4f8 = local_608;
          *(int *)cur_ix_masked_1 = (int)prev_ix_masked;
          *(int *)(cur_ix_masked_1 + 4) = (int)(local_608 << 5);
          cur_ix_masked_1 = cur_ix_masked_1 + 8;
        }
        if (_key <= local_608) {
          if (forest._4_4_ != 0) {
            local_468 = local_560;
            local_470 = node_left;
            *(undefined4 *)(prev_ix_1 + node_right * 4) =
                 *(undefined4 *)(prev_ix_1 + (node_left & *local_560) * 8);
            local_438 = local_560;
            local_440 = node_left;
            *(undefined4 *)(prev_ix_1 + best_len_left * 4) =
                 *(undefined4 *)(prev_ix_1 + 4 + (node_left & *local_560) * 8);
          }
          goto LAB_0012079d;
        }
        if (local_568[cur_len + local_608] < local_568[max_comp_len + local_608]) {
          best_len_right = local_608;
          if (forest._4_4_ != 0) {
            *(int *)(prev_ix_1 + node_right * 4) = (int)node_left;
          }
          local_428 = local_560;
          local_430 = node_left;
          node_right = (node_left & *local_560) * 2 + 1;
          uVar1 = *(uint *)(prev_ix_1 + node_right * 4);
        }
        else {
          depth_remaining = local_608;
          if (forest._4_4_ != 0) {
            *(int *)(prev_ix_1 + best_len_left * 4) = (int)node_left;
          }
          local_458 = local_560;
          local_460 = node_left;
          best_len_left = (node_left & *local_560) * 2;
          uVar1 = *(uint *)(prev_ix_1 + (node_left & *local_560) * 8);
        }
        backward_1 = backward_1 - 1;
      }
      if (forest._4_4_ != 0) {
        *(int *)(prev_ix_1 + node_right * 4) = (int)local_560[0x10001];
        *(int *)(prev_ix_1 + best_len_left * 4) = (int)local_560[0x10001];
      }
LAB_0012079d:
      orig_matches = (BackwardMatch *)cur_ix_masked_1;
    }
    for (prev_ix = 0; prev_ix < 0x26; prev_ix = prev_ix + 1) {
      dict_matches[prev_ix - 2] = 0xfffffff;
    }
    local_6b8 = short_match_max_backward + 1;
    local_6b0 = 4;
    local_2150 = local_6b8;
    if (local_6b8 < 4) {
      local_2150 = 4;
    }
    iVar4 = BrotliFindAllStaticDictionaryMatches
                      (local_6f0,local_6f8 + best_len,local_2150,local_710,(uint32_t *)&i_1);
    if (iVar4 != 0) {
      local_6d8 = 0x25;
      local_6e0 = local_710;
      if (local_710 < 0x26) {
        local_2158 = local_710;
      }
      else {
        local_2158 = 0x25;
      }
      for (uStack_830 = local_2150; pBVar2 = orig_matches, uStack_830 <= local_2158;
          uStack_830 = uStack_830 + 1) {
        local_2168 = dict_matches[uStack_830 - 2];
        if ((local_2168 < 0xfffffff) &&
           (uVar7 = local_718 + local_720 + (ulong)(local_2168 >> 5) + 1,
           uVar7 <= (local_728->dist).max_distance)) {
          orig_matches = orig_matches + 1;
          local_2168 = local_2168 & 0x1f;
          local_4c0 = pBVar2;
          local_4c8 = uVar7;
          local_4d0 = uStack_830;
          local_4d8 = (ulong)local_2168;
          pBVar2->distance = (uint32_t)uVar7;
          if (uStack_830 == local_2168) {
            local_2168 = 0;
          }
          pBVar2->length_and_code = (uint)(uStack_830 << 5) | local_2168;
        }
      }
    }
    local_2118 = (long)((long)orig_matches - cur_ix_masked) >> 3;
    if ((local_2118 != 0) &&
       (local_6c0 = matches + (local_2118 - 2), uVar3 < matches[local_2118 - 2].length_and_code >> 5
       )) {
      store_end = *(size_t *)(matches + (local_2118 - 2));
      local_2118 = 1;
    }
    num_matches = UpdateNodes(num_bytes,position,gap,ringbuffer,ringbuffer_mask,params,
                              max_backward_limit,dist_cache,local_2118,(BackwardMatch *)&store_end,
                              (ZopfliCostModel *)&queue.idx_,(StartPosQueue *)(matches + 0x17f),
                              nodes);
    if (num_matches < 0x4000) {
      num_matches = 0;
    }
    if (local_2118 == 1) {
      local_6c8 = &store_end;
      if (uVar3 < store_end._4_4_ >> 5) {
        local_6d0 = &store_end;
        local_6a0 = (ulong)(store_end._4_4_ >> 5);
        local_6a8 = num_matches;
        local_2170 = local_6a0;
        if (local_6a0 <= num_matches) {
          local_2170 = num_matches;
        }
        num_matches = local_2170;
      }
    }
    if (1 < num_matches) {
      local_698 = (H10 *)(uVar5 + 1);
      local_2198 = uVar5 + num_matches;
      if (local_2120 <= local_2198) {
        local_2198 = local_2120;
      }
      local_668 = hasher;
      i_2 = local_2198;
      j = (size_t)local_698;
      if (uVar5 + 0x40 <= local_2198) {
        j = local_2198 - 0x3f;
      }
      local_680 = local_698;
      local_678 = ringbuffer_mask;
      local_670 = ringbuffer;
      if (uVar5 + 0x201 <= j) {
        for (; local_698 < j; local_698 = (H10 *)local_698->buckets_) {
          local_3e0 = local_668;
          local_3e8 = local_670;
          local_3f0 = local_678;
          self = local_698;
          local_2b0 = local_668;
          local_220 = local_668;
          max_backward = (size_t)(local_668 + 0x28);
          local_408 = *(ulong *)max_backward - 0xf;
          local_338 = local_670;
          local_340 = local_698;
          local_348 = local_678;
          local_350 = 0x80;
          local_360 = (ulong *)0x0;
          cur_ix_masked_2 = 0;
          max_comp_len_1 = (ulong)local_698 & local_678;
          local_310 = 0x80;
          local_318 = 0x80;
          _key_1 = 0x80;
          forest_1._4_4_ = 1;
          local_358 = local_408;
          local_330 = (ulong *)max_backward;
          forest_1._0_4_ = HashBytesH10(local_670 + max_comp_len_1);
          local_288 = local_330;
          prev_ix_2 = (size_t)(local_330 + 0x10002);
          uVar1 = *(uint *)((long)local_330 + (ulong)(uint32_t)forest_1 * 4 + 8);
          local_258 = local_330;
          local_260 = local_340;
          node_right_1 = ((ulong)local_340 & *local_330) << 1;
          local_228 = local_330;
          local_230 = local_340;
          best_len_left_1 = ((ulong)local_340 & *local_330) * 2 + 1;
          best_len_right_1 = 0;
          depth_remaining_1 = 0;
          if (forest_1._4_4_ != 0) {
            *(int *)((long)local_330 + (ulong)(uint32_t)forest_1 * 4 + 8) = (int)local_340;
          }
          backward_2 = 0x40;
          while( true ) {
            node_left_1 = (size_t)uVar1;
            prev_ix_masked_1 = (long)local_340 - node_left_1;
            cur_len_1 = node_left_1 & local_348;
            if (((prev_ix_masked_1 == 0) || (local_358 < prev_ix_masked_1)) || (backward_2 == 0))
            break;
            local_320 = best_len_right_1;
            local_328 = depth_remaining_1;
            if (best_len_right_1 < depth_remaining_1) {
              local_21a8 = best_len_right_1;
            }
            else {
              local_21a8 = depth_remaining_1;
            }
            len_2 = local_21a8;
            local_2d8 = local_338 + max_comp_len_1 + local_21a8;
            local_2e0 = (ulong *)(local_338 + cur_len_1 + local_21a8);
            matched_2 = local_350 - local_21a8;
            limit2_2 = 0;
            x_2 = (matched_2 >> 3) + 1;
LAB_00121118:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              local_290 = local_2e0;
              local_298 = (ulong *)(local_2d8 + limit2_2);
              if (*local_2e0 == *local_298) goto LAB_0012117a;
              local_2a0 = local_2e0;
              local_2a8 = (ulong *)(local_2d8 + limit2_2);
              iVar4 = 0;
              matching_bits_2 = *local_2e0 ^ *local_2a8;
              for (uVar5 = matching_bits_2; (uVar5 & 1) == 0;
                  uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                iVar4 = iVar4 + 1;
              }
              local_308 = (ulong)iVar4;
              local_2d0 = (local_308 >> 3) + limit2_2;
              goto LAB_001212bb;
            }
            matched_2 = (matched_2 & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (local_2d8[limit2_2] != (uint8_t)*local_2e0) {
                local_2d0 = limit2_2;
                goto LAB_001212bb;
              }
              local_2e0 = (ulong *)((long)local_2e0 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_2d0 = limit2_2;
LAB_001212bb:
            local_3d8 = local_21a8 + local_2d0;
            if ((cur_ix_masked_2 != 0) && (*local_360 < local_3d8)) {
              *local_360 = local_3d8;
              local_2b8 = cur_ix_masked_2;
              *(int *)cur_ix_masked_2 = (int)prev_ix_masked_1;
              *(int *)(cur_ix_masked_2 + 4) = (int)local_3d8 * 0x20;
              cur_ix_masked_2 = cur_ix_masked_2 + 8;
              local_2c8 = local_3d8;
              local_2c0 = prev_ix_masked_1;
            }
            limit2_2 = local_2d0;
            if (_key_1 <= local_3d8) {
              if (forest_1._4_4_ != 0) {
                local_278 = local_330;
                local_280 = node_left_1;
                *(int *)(prev_ix_2 + node_right_1 * 4) =
                     (int)*(ulong *)(prev_ix_2 + (node_left_1 & *local_330) * 8);
                local_248 = local_330;
                local_250 = node_left_1;
                *(undefined4 *)(prev_ix_2 + best_len_left_1 * 4) =
                     *(undefined4 *)((long)local_330 + (node_left_1 & *local_330) * 8 + 0x80014);
              }
              goto LAB_0012157a;
            }
            if (local_338[cur_len_1 + local_3d8] < local_338[max_comp_len_1 + local_3d8]) {
              if (forest_1._4_4_ != 0) {
                *(uint *)(prev_ix_2 + node_right_1 * 4) = uVar1;
              }
              local_238 = local_330;
              local_240 = node_left_1;
              node_right_1 = (node_left_1 & *local_330) * 2 + 1;
              uVar1 = *(uint *)(prev_ix_2 + node_right_1 * 4);
              best_len_right_1 = local_3d8;
            }
            else {
              if (forest_1._4_4_ != 0) {
                *(uint *)(prev_ix_2 + best_len_left_1 * 4) = uVar1;
              }
              local_268 = local_330;
              local_270 = node_left_1;
              best_len_left_1 = (node_left_1 & *local_330) * 2;
              uVar1 = (uint)*(ulong *)(prev_ix_2 + (node_left_1 & *local_330) * 8);
              depth_remaining_1 = local_3d8;
            }
            backward_2 = backward_2 - 1;
          }
          if (forest_1._4_4_ != 0) {
            *(int *)(prev_ix_2 + node_right_1 * 4) = (int)local_330[0x10001];
            *(int *)(prev_ix_2 + best_len_left_1 * 4) = (int)local_330[0x10001];
          }
LAB_0012157a:
        }
      }
      for (; j < i_2; j = j + 1) {
        local_1f0 = local_668;
        local_1f8 = local_670;
        local_200 = local_678;
        self_1 = (H10 *)j;
        local_c0 = local_668;
        local_30 = local_668;
        max_backward_1 = (size_t)(local_668 + 0x28);
        local_218 = *(ulong *)max_backward_1 - 0xf;
        local_148 = local_670;
        local_150 = j;
        local_158 = local_678;
        local_160 = 0x80;
        local_170 = (ulong *)0x0;
        cur_ix_masked_3 = 0;
        max_comp_len_2 = j & local_678;
        local_120 = 0x80;
        local_128 = 0x80;
        _key_2 = 0x80;
        forest_2._4_4_ = 1;
        local_168 = local_218;
        local_140 = (ulong *)max_backward_1;
        forest_2._0_4_ = HashBytesH10(local_670 + max_comp_len_2);
        local_98 = local_140;
        prev_ix_3 = (size_t)(local_140 + 0x10002);
        uVar1 = *(uint *)((long)local_140 + (ulong)(uint32_t)forest_2 * 4 + 8);
        local_68 = local_140;
        local_70 = local_150;
        node_right_2 = (local_150 & *local_140) << 1;
        local_38 = local_140;
        local_40 = local_150;
        best_len_left_2 = (local_150 & *local_140) * 2 + 1;
        best_len_right_2 = 0;
        depth_remaining_2 = 0;
        if (forest_2._4_4_ != 0) {
          *(int *)((long)local_140 + (ulong)(uint32_t)forest_2 * 4 + 8) = (int)local_150;
        }
        backward_3 = 0x40;
        while( true ) {
          node_left_2 = (size_t)uVar1;
          prev_ix_masked_2 = local_150 - node_left_2;
          cur_len_2 = node_left_2 & local_158;
          if (((prev_ix_masked_2 == 0) || (local_168 < prev_ix_masked_2)) || (backward_3 == 0))
          break;
          local_130 = best_len_right_2;
          local_138 = depth_remaining_2;
          if (best_len_right_2 < depth_remaining_2) {
            local_21c0 = best_len_right_2;
          }
          else {
            local_21c0 = depth_remaining_2;
          }
          len_3 = local_21c0;
          local_e8 = local_148 + max_comp_len_2 + local_21c0;
          local_f0 = (ulong *)(local_148 + cur_len_2 + local_21c0);
          matched_3 = local_160 - local_21c0;
          limit2_3 = 0;
          x_3 = (matched_3 >> 3) + 1;
LAB_00121974:
          x_3 = x_3 - 1;
          if (x_3 != 0) {
            local_a0 = local_f0;
            local_a8 = (ulong *)(local_e8 + limit2_3);
            if (*local_f0 == *local_a8) goto LAB_001219d6;
            local_b0 = local_f0;
            local_b8 = (ulong *)(local_e8 + limit2_3);
            iVar4 = 0;
            matching_bits_3 = *local_f0 ^ *local_b8;
            for (uVar5 = matching_bits_3; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000)
            {
              iVar4 = iVar4 + 1;
            }
            local_118 = (ulong)iVar4;
            local_e0 = (local_118 >> 3) + limit2_3;
            goto LAB_00121b17;
          }
          matched_3 = (matched_3 & 7) + 1;
          while (matched_3 = matched_3 - 1, matched_3 != 0) {
            if (local_e8[limit2_3] != (uint8_t)*local_f0) {
              local_e0 = limit2_3;
              goto LAB_00121b17;
            }
            local_f0 = (ulong *)((long)local_f0 + 1);
            limit2_3 = limit2_3 + 1;
          }
          local_e0 = limit2_3;
LAB_00121b17:
          local_1e8 = local_21c0 + local_e0;
          if ((cur_ix_masked_3 != 0) && (*local_170 < local_1e8)) {
            *local_170 = local_1e8;
            local_c8 = cur_ix_masked_3;
            *(int *)cur_ix_masked_3 = (int)prev_ix_masked_2;
            *(int *)(cur_ix_masked_3 + 4) = (int)local_1e8 * 0x20;
            cur_ix_masked_3 = cur_ix_masked_3 + 8;
            local_d8 = local_1e8;
            local_d0 = prev_ix_masked_2;
          }
          limit2_3 = local_e0;
          if (_key_2 <= local_1e8) {
            if (forest_2._4_4_ != 0) {
              local_88 = local_140;
              local_90 = node_left_2;
              *(int *)(prev_ix_3 + node_right_2 * 4) =
                   (int)*(ulong *)(prev_ix_3 + (node_left_2 & *local_140) * 8);
              local_58 = local_140;
              local_60 = node_left_2;
              *(undefined4 *)(prev_ix_3 + best_len_left_2 * 4) =
                   *(undefined4 *)((long)local_140 + (node_left_2 & *local_140) * 8 + 0x80014);
            }
            goto LAB_00121da5;
          }
          if (local_148[cur_len_2 + local_1e8] < local_148[max_comp_len_2 + local_1e8]) {
            if (forest_2._4_4_ != 0) {
              *(uint *)(prev_ix_3 + node_right_2 * 4) = uVar1;
            }
            local_48 = local_140;
            local_50 = node_left_2;
            node_right_2 = (node_left_2 & *local_140) * 2 + 1;
            uVar1 = *(uint *)(prev_ix_3 + node_right_2 * 4);
            best_len_right_2 = local_1e8;
          }
          else {
            if (forest_2._4_4_ != 0) {
              *(uint *)(prev_ix_3 + best_len_left_2 * 4) = uVar1;
            }
            local_78 = local_140;
            local_80 = node_left_2;
            best_len_left_2 = (node_left_2 & *local_140) * 2;
            uVar1 = (uint)*(ulong *)(prev_ix_3 + (node_left_2 & *local_140) * 8);
            depth_remaining_2 = local_1e8;
          }
          backward_3 = backward_3 - 1;
        }
        if (forest_2._4_4_ != 0) {
          *(int *)(prev_ix_3 + node_right_2 * 4) = (int)local_140[0x10001];
          *(int *)(prev_ix_3 + best_len_left_2 * 4) = (int)local_140[0x10001];
        }
LAB_00121da5:
      }
      while ((num_matches = num_matches - 1, num_matches != 0 &&
             (sVar8 = gap + 1, uVar5 = gap + 4, gap = sVar8, uVar5 < num_bytes))) {
        EvaluateNode(position,sVar8,max_backward_limit,0,dist_cache,(ZopfliCostModel *)&queue.idx_,
                     (StartPosQueue *)(matches + 0x17f),nodes);
      }
    }
    gap = gap + 1;
  } while( true );
LAB_0012039d:
  local_510 = local_510 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0012033b;
LAB_0012117a:
  local_2e0 = local_2e0 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00121118;
LAB_001219d6:
  local_f0 = local_f0 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00121974;
LAB_0011fdad:
  local_638 = local_638 + 1;
  limit2 = limit2 + 8;
  goto LAB_0011fd4b;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    const size_t max_backward_limit, const int* dist_cache, HasherHandle hasher,
    ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t skip;
    size_t num_matches = FindAllMatchesH10(hasher, &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance, gap,
        params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position, i, max_backward_limit, gap, dist_cache, &model,
            &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}